

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void __thiscall
NDeviceChannel::serialize<cereal::PortableBinaryInputArchive>
          (NDeviceChannel *this,PortableBinaryInputArchive *archive)

{
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)archive,&this->id,
             &this->startByte,&this->startBit,&this->type,&this->interleavedDataByte,
             &this->interleavedDataBit);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, startByte, startBit, type, interleavedDataByte, interleavedDataBit);
    }